

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_true> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>,256,false>>
::linear_search_impl<std::__cxx11::string,phmap::priv::StringBtreeDefaultLess>
          (btree_node<phmap::priv::map_params<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>,256,false>>
           *this,string *k,int s,int e,StringBtreeDefaultLess *comp)

{
  SearchResult<int,_true> SVar1;
  StringBtreeDefaultLess *this_00;
  bool bVar2;
  key_type *this_01;
  string_view sVar3;
  OnlyLiteralZero<std::nullptr_t> local_64;
  value_type local_63;
  OnlyLiteralZero<std::nullptr_t> local_62;
  value_type local_61;
  string_view local_60;
  string_view local_50;
  value_type local_39;
  StringBtreeDefaultLess *pSStack_38;
  weak_ordering c;
  StringBtreeDefaultLess *comp_local;
  int e_local;
  int s_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_256,_false>_>
  *this_local;
  uint uStack_c;
  
  pSStack_38 = comp;
  for (comp_local._4_4_ = s; this_00 = pSStack_38, comp_local._4_4_ < e;
      comp_local._4_4_ = comp_local._4_4_ + 1) {
    this_01 = btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_256,_false>_>
              ::key((btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_256,_false>_>
                     *)this,(long)comp_local._4_4_);
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01)
    ;
    local_50 = sVar3;
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(k);
    local_60 = sVar3;
    local_61 = (value_type)StringBtreeDefaultLess::operator()(this_00,&local_50,&local_60);
    local_39 = local_61;
    compare_internal::OnlyLiteralZero<std::nullptr_t>::OnlyLiteralZero(&local_62,(void *)0x0);
    bVar2 = phmap::operator==(local_61);
    if (bVar2) {
      uStack_c = uStack_c & 0xffffff00;
      goto LAB_00402594;
    }
    local_63 = local_39;
    compare_internal::OnlyLiteralZero<std::nullptr_t>::OnlyLiteralZero(&local_64,(void *)0x0);
    bVar2 = phmap::operator>(local_63);
    if (bVar2) break;
  }
  uStack_c = CONCAT31(uStack_c._1_3_,1);
LAB_00402594:
  SVar1._4_4_ = uStack_c;
  SVar1.value = comp_local._4_4_;
  return SVar1;
}

Assistant:

SearchResult<int, true> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::true_type /* IsCompareTo */) const {
            while (s < e) {
                const phmap::weak_ordering c = comp(key(s), k);
                if (c == 0) {
                    return {s, MatchKind::kEq};
                } else if (c > 0) {
                    break;
                }
                ++s;
            }
            return {s, MatchKind::kNe};
        }